

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_outputs_tests.cpp
# Opt level: O3

void __thiscall
wallet::group_outputs_tests::outputs_grouping_tests::test_method(outputs_grouping_tests *this)

{
  pointer pCVar1;
  string label;
  string label_00;
  string label_01;
  string label_02;
  string label_03;
  string label_04;
  MockableData records;
  CWallet *pCVar2;
  Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
  *pRVar3;
  T *pTVar4;
  mapped_type *pmVar5;
  iterator pvVar6;
  iterator pvVar7;
  long lVar8;
  long in_FS_OFFSET;
  const_string file;
  const_string msg;
  CTxDestination dest7;
  CTxDestination dest5;
  CTxDestination dest4;
  CTxDestination dest3;
  CTxDestination dest2;
  CTxDestination dest;
  GroupVerifier group_verifier;
  undefined4 in_stack_fffffffffffffb88;
  undefined4 uVar9;
  undefined4 in_stack_fffffffffffffb8c;
  undefined4 uVar10;
  undefined8 in_stack_fffffffffffffb90;
  char *pcVar11;
  undefined8 in_stack_fffffffffffffb98;
  char *pcVar12;
  undefined8 in_stack_fffffffffffffba0;
  undefined1 *puVar13;
  undefined8 in_stack_fffffffffffffba8;
  size_t in_stack_fffffffffffffbb0;
  CWallet *local_440;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_438;
  CoinEligibilityFilter local_430;
  long *local_410 [2];
  long local_400 [2];
  _Variadic_union<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  local_3f0;
  long *local_3a0 [2];
  long local_390 [2];
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  local_380;
  long *local_330 [2];
  long local_320 [2];
  undefined1 local_310 [80];
  long *local_2c0 [2];
  long local_2b0 [2];
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  local_2a0;
  long *local_250 [2];
  long local_240 [2];
  _Variadic_union<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  local_230;
  long *local_1e0 [2];
  long local_1d0 [2];
  undefined1 local_1c0 [24];
  undefined1 local_1a8;
  undefined7 uStack_1a7;
  _Variadic_union<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  local_168;
  undefined1 local_118 [16];
  _Base_ptr local_108;
  _Base_ptr local_100;
  _Base_ptr local_f8;
  _Base_ptr local_f0;
  _Base_ptr local_e8;
  size_t local_e0;
  CAmount CStack_d8;
  _Storage<long,_true> local_d0;
  bool local_c8;
  FastRandomContext local_c0;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_1c0._0_8_ =
       (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_ChainTestingSetup.super_BasicTestingSetup.
       m_node.chain._M_t.
       super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>._M_t.
       super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
       super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
  local_100 = (_Base_ptr)(local_118 + 8);
  local_118._0_8_ = (element_type *)0x0;
  local_118._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_108 = (_Base_ptr)0x0;
  local_f0 = (_Base_ptr)0x0;
  records._M_t._M_impl._4_4_ = in_stack_fffffffffffffb8c;
  records._M_t._M_impl._0_4_ = in_stack_fffffffffffffb88;
  records._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = in_stack_fffffffffffffb90;
  records._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)in_stack_fffffffffffffb98;
  records._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)in_stack_fffffffffffffba0;
  records._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)in_stack_fffffffffffffba8;
  records._M_t._M_impl.super__Rb_tree_header._M_node_count = in_stack_fffffffffffffbb0;
  local_f8 = local_100;
  CreateMockableWalletDatabase((wallet *)&local_230._M_first,records);
  std::
  make_unique<wallet::CWallet,interfaces::Chain*,char_const(&)[1],std::unique_ptr<wallet::WalletDatabase,std::default_delete<wallet::WalletDatabase>>>
            ((Chain **)&local_168,(char (*) [1])local_1c0,
             (unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> *)
             0xf4aea1);
  if ((long *)local_230._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_230._0_8_ + 8))();
  }
  local_230._0_8_ = 0;
  std::
  _Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
               *)local_118);
  CWallet::LoadWallet((CWallet *)local_168._0_8_);
  local_1c0._0_8_ = local_168._0_8_ + 0x1e8;
  local_1c0._8_8_ = local_1c0._8_8_ & 0xffffffffffffff00;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)local_1c0);
  CWallet::SetWalletFlag((CWallet *)local_168._0_8_,0x400000000);
  CWallet::SetupDescriptorScriptPubKeyMans((CWallet *)local_168._0_8_);
  std::__shared_ptr<wallet::CWallet,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<wallet::CWallet,std::default_delete<wallet::CWallet>,void>
            ((__shared_ptr<wallet::CWallet,(__gnu_cxx::_Lock_policy)2> *)&local_440,
             (unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
             &local_168._M_first);
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)local_1c0);
  std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::~unique_ptr
            ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
             &local_168._M_first);
  local_f0 = (_Base_ptr)&local_100;
  local_118._0_8_ = (element_type *)0x0;
  local_118._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_100 = (_Base_ptr)((ulong)local_100 & 0xffffffff00000000);
  local_f8 = (_Base_ptr)0x0;
  local_e0 = 0;
  CStack_d8 = 0;
  local_d0._M_value = 0;
  local_c8 = true;
  local_e8 = local_f0;
  FastRandomContext::FastRandomContext(&local_c0,false);
  local_118._0_8_ = local_440;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_118 + 8),&local_438);
  pCVar2 = local_440;
  local_430.conf_mine = 1;
  local_430.conf_theirs = 6;
  local_430.max_ancestors = 0;
  local_430.max_descendants = 0;
  local_430.m_include_partial_groups = false;
  local_1e0[0] = local_1d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"");
  label._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffb8c;
  label._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffb88;
  label._M_string_length = in_stack_fffffffffffffb90;
  label.field_2._M_allocated_capacity = in_stack_fffffffffffffb98;
  label.field_2._8_8_ = in_stack_fffffffffffffba0;
  CWallet::GetNewDestination
            ((Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
              *)local_1c0,pCVar2,BECH32,label);
  pRVar3 = inline_assertion_check<true,util::Result<std::variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>>>
                     ((Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
                       *)local_1c0,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/group_outputs_tests.cpp"
                      ,0x7c,"test_method","wallet->GetNewDestination(OutputType::BECH32, \"\")");
  pTVar4 = util::
           Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
           ::value(pRVar3);
  std::__detail::__variant::
  _Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                     *)&local_168._M_first,
                    (_Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                     *)pTVar4);
  std::__detail::__variant::
  _Variant_storage<false,_bilingual_str,_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
  ::~_Variant_storage((_Variant_storage<false,_bilingual_str,_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
                       *)local_1c0);
  if (local_1e0[0] != local_1d0) {
    operator_delete(local_1e0[0],local_1d0[0] + 1);
  }
  lVar8 = 10;
  do {
    local_1c0._0_8_ = (mutex_type *)0x3b9aca00;
    uVar9 = 6;
    addCoin((CoinsResult *)&local_108,local_440,(CTxDestination *)&local_168._M_first,
            (CAmount *)local_1c0,true,(CFeeRate)0x0,6);
    lVar8 = lVar8 + -1;
  } while (lVar8 != 0);
  GroupVerifier::GroupVerify((GroupVerifier *)local_118,BECH32,&local_430,false,true,10);
  GroupVerifier::GroupVerify((GroupVerifier *)local_118,BECH32,&local_430,true,true,1);
  pCVar2 = local_440;
  local_250[0] = local_240;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_250,"");
  label_00._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffb8c;
  label_00._M_dataplus._M_p._0_4_ = uVar9;
  label_00._M_string_length = in_stack_fffffffffffffb90;
  label_00.field_2._M_allocated_capacity = in_stack_fffffffffffffb98;
  label_00.field_2._8_8_ = in_stack_fffffffffffffba0;
  CWallet::GetNewDestination
            ((Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
              *)local_1c0,pCVar2,BECH32,label_00);
  pRVar3 = inline_assertion_check<true,util::Result<std::variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>>>
                     ((Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
                       *)local_1c0,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/group_outputs_tests.cpp"
                      ,0x8c,"test_method","wallet->GetNewDestination(OutputType::BECH32, \"\")");
  pTVar4 = util::
           Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
           ::value(pRVar3);
  std::__detail::__variant::
  _Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                     *)&local_230._M_first,
                    (_Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                     *)pTVar4);
  std::__detail::__variant::
  _Variant_storage<false,_bilingual_str,_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
  ::~_Variant_storage((_Variant_storage<false,_bilingual_str,_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
                       *)local_1c0);
  if (local_250[0] != local_240) {
    operator_delete(local_250[0],local_240[0] + 1);
  }
  lVar8 = 10;
  do {
    local_1c0._0_8_ = (mutex_type *)0x1dcd6500;
    uVar9 = 6;
    addCoin((CoinsResult *)&local_108,local_440,(CTxDestination *)&local_230._M_first,
            (CAmount *)local_1c0,true,(CFeeRate)0x0,6);
    lVar8 = lVar8 + -1;
  } while (lVar8 != 0);
  GroupVerifier::GroupVerify((GroupVerifier *)local_118,BECH32,&local_430,false,true,0x14);
  GroupVerifier::GroupVerify((GroupVerifier *)local_118,BECH32,&local_430,true,true,2);
  pCVar2 = local_440;
  local_2c0[0] = local_2b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2c0,"");
  label_01._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffb8c;
  label_01._M_dataplus._M_p._0_4_ = uVar9;
  label_01._M_string_length = in_stack_fffffffffffffb90;
  label_01.field_2._M_allocated_capacity = in_stack_fffffffffffffb98;
  label_01.field_2._8_8_ = in_stack_fffffffffffffba0;
  CWallet::GetNewDestination
            ((Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
              *)local_1c0,pCVar2,BECH32,label_01);
  pRVar3 = inline_assertion_check<true,util::Result<std::variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>>>
                     ((Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
                       *)local_1c0,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/group_outputs_tests.cpp"
                      ,0x9b,"test_method","wallet->GetNewDestination(OutputType::BECH32, \"\")");
  pTVar4 = util::
           Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
           ::value(pRVar3);
  std::__detail::__variant::
  _Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                     *)&local_2a0,
                    (_Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                     *)pTVar4);
  std::__detail::__variant::
  _Variant_storage<false,_bilingual_str,_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
  ::~_Variant_storage((_Variant_storage<false,_bilingual_str,_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
                       *)local_1c0);
  if (local_2c0[0] != local_2b0) {
    operator_delete(local_2c0[0],local_2b0[0] + 1);
  }
  local_1c0._0_8_ = (mutex_type *)0x1;
  pvVar7 = (iterator)0x64;
  pvVar6 = (iterator)0x1;
  addCoin((CoinsResult *)&local_108,local_440,(CTxDestination *)&local_2a0,(CAmount *)local_1c0,true
          ,(CFeeRate)0x64,6);
  puVar13 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x9d;
  file.m_begin = &stack0xfffffffffffffbb0;
  msg.m_end = pvVar7;
  msg.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,
             (size_t)&stack0xfffffffffffffba0,msg);
  local_3f0._0_4_ = 2;
  pmVar5 = std::
           map<OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
           ::operator[]((map<OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
                         *)&local_108,(key_type *)&local_3f0);
  pCVar1 = (pmVar5->super__Vector_base<wallet::COutput,_std::allocator<wallet::COutput>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pCVar1[-1].effective_value.super__Optional_base<long,_true,_true>._M_payload.
      super__Optional_payload_base<long>._M_engaged != false) {
    local_310[0] = pCVar1[-1].effective_value.super__Optional_base<long,_true,_true>._M_payload.
                   super__Optional_payload_base<long>._M_payload._M_value < 1;
    local_310._8_8_ = (element_type *)0x0;
    local_310._16_8_ = (sp_counted_base *)0x0;
    _local_1a8 = &local_380;
    local_380._M_u._0_8_ =
         "group_verifier.coins_pool.coins[OutputType::BECH32].back().GetEffectiveValue() <= 0";
    local_380._M_u._8_8_ =
         (long)"group_verifier.coins_pool.coins[OutputType::BECH32].back().GetEffectiveValue() <= 0"
         + 0x53;
    local_1c0._8_8_ = local_1c0._8_8_ & 0xffffffffffffff00;
    local_1c0._0_8_ = &PTR__lazy_ostream_01389048;
    local_1c0._16_8_ = boost::unit_test::lazy_ostream::inst;
    pcVar11 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/group_outputs_tests.cpp"
    ;
    pcVar12 = "";
    uVar9 = 0;
    uVar10 = 0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_310,(lazy_ostream *)local_1c0,1,0,WARN,0xf601cd,
               (size_t)&stack0xfffffffffffffb90,0x9d);
    boost::detail::shared_count::~shared_count((shared_count *)(local_310 + 0x10));
    GroupVerifier::GroupVerify((GroupVerifier *)local_118,BECH32,&local_430,false,true,0x14);
    GroupVerifier::GroupVerify((GroupVerifier *)local_118,BECH32,&local_430,true,true,2);
    GroupVerifier::GroupVerify((GroupVerifier *)local_118,BECH32,&local_430,false,false,0x15);
    GroupVerifier::GroupVerify((GroupVerifier *)local_118,BECH32,&local_430,true,false,3);
    pCVar2 = local_440;
    local_330[0] = local_320;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_330,"");
    label_02._M_dataplus._M_p._4_4_ = uVar10;
    label_02._M_dataplus._M_p._0_4_ = uVar9;
    label_02._M_string_length = (size_type)pcVar11;
    label_02.field_2._M_allocated_capacity = (size_type)pcVar12;
    label_02.field_2._8_8_ = puVar13;
    CWallet::GetNewDestination
              ((Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
                *)local_1c0,pCVar2,BECH32,label_02);
    pRVar3 = inline_assertion_check<true,util::Result<std::variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>>>
                       ((Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
                         *)local_1c0,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/group_outputs_tests.cpp"
                        ,0xb3,"test_method","wallet->GetNewDestination(OutputType::BECH32, \"\")");
    pTVar4 = util::
             Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
             ::value(pRVar3);
    std::__detail::__variant::
    _Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_310,
                      (_Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)pTVar4);
    std::__detail::__variant::
    _Variant_storage<false,_bilingual_str,_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
    ::~_Variant_storage((_Variant_storage<false,_bilingual_str,_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
                         *)local_1c0);
    if (local_330[0] != local_320) {
      operator_delete(local_330[0],local_320[0] + 1);
    }
    local_1c0._0_8_ = (mutex_type *)0x23c34600;
    uVar9 = 5;
    addCoin((CoinsResult *)&local_108,local_440,(CTxDestination *)local_310,(CAmount *)local_1c0,
            false,(CFeeRate)0x0,5);
    GroupVerifier::GroupVerify((GroupVerifier *)local_118,BECH32,&local_430,false,false,0x15);
    GroupVerifier::GroupVerify((GroupVerifier *)local_118,BECH32,&local_430,true,false,3);
    pCVar2 = local_440;
    local_3a0[0] = local_390;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3a0,"");
    label_03._M_dataplus._M_p._4_4_ = uVar10;
    label_03._M_dataplus._M_p._0_4_ = uVar9;
    label_03._M_string_length = (size_type)pcVar11;
    label_03.field_2._M_allocated_capacity = (size_type)pcVar12;
    label_03.field_2._8_8_ = puVar13;
    CWallet::GetNewDestination
              ((Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
                *)local_1c0,pCVar2,BECH32,label_03);
    pRVar3 = inline_assertion_check<true,util::Result<std::variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>>>
                       ((Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
                         *)local_1c0,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/group_outputs_tests.cpp"
                        ,0xc4,"test_method","wallet->GetNewDestination(OutputType::BECH32, \"\")");
    pTVar4 = util::
             Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
             ::value(pRVar3);
    std::__detail::__variant::
    _Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&local_380,
                      (_Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)pTVar4);
    std::__detail::__variant::
    _Variant_storage<false,_bilingual_str,_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
    ::~_Variant_storage((_Variant_storage<false,_bilingual_str,_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
                         *)local_1c0);
    if (local_3a0[0] != local_390) {
      operator_delete(local_3a0[0],local_390[0] + 1);
    }
    local_1c0._0_8_ = (mutex_type *)0x23c34600;
    uVar9 = 0;
    addCoin((CoinsResult *)&local_108,local_440,(CTxDestination *)&local_380,(CAmount *)local_1c0,
            true,(CFeeRate)0x0,0);
    GroupVerifier::GroupVerify((GroupVerifier *)local_118,BECH32,&local_430,false,false,0x15);
    GroupVerifier::GroupVerify((GroupVerifier *)local_118,BECH32,&local_430,true,false,3);
    pCVar2 = local_440;
    local_410[0] = local_400;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_410,"");
    label_04._M_dataplus._M_p._4_4_ = uVar10;
    label_04._M_dataplus._M_p._0_4_ = uVar9;
    label_04._M_string_length = (size_type)pcVar11;
    label_04.field_2._M_allocated_capacity = (size_type)pcVar12;
    label_04.field_2._8_8_ = puVar13;
    CWallet::GetNewDestination
              ((Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
                *)local_1c0,pCVar2,BECH32,label_04);
    pRVar3 = inline_assertion_check<true,util::Result<std::variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>>>
                       ((Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
                         *)local_1c0,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/group_outputs_tests.cpp"
                        ,0xd3,"test_method","wallet->GetNewDestination(OutputType::BECH32, \"\")");
    pTVar4 = util::
             Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
             ::value(pRVar3);
    std::__detail::__variant::
    _Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&local_3f0._M_first,
                      (_Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)pTVar4);
    std::__detail::__variant::
    _Variant_storage<false,_bilingual_str,_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
    ::~_Variant_storage((_Variant_storage<false,_bilingual_str,_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
                         *)local_1c0);
    if (local_410[0] != local_400) {
      operator_delete(local_410[0],local_400[0] + 1);
    }
    lVar8 = 0x65;
    do {
      local_1c0._0_8_ = (mutex_type *)0x35a4e900;
      addCoin((CoinsResult *)&local_108,local_440,(CTxDestination *)&local_3f0._M_first,
              (CAmount *)local_1c0,true,(CFeeRate)0x0,6);
      lVar8 = lVar8 + -1;
    } while (lVar8 != 0);
    GroupVerifier::GroupVerify((GroupVerifier *)local_118,BECH32,&local_430,false,false,0x7a);
    GroupVerifier::GroupVerify((GroupVerifier *)local_118,BECH32,&local_430,true,false,4);
    local_1c0._0_8_ = (mutex_type *)0x600000001;
    local_1c0._8_8_ = 0;
    local_1c0._16_8_ = 0;
    local_1a8 = 1;
    GroupVerifier::GroupVerify
              ((GroupVerifier *)local_118,BECH32,(CoinEligibilityFilter *)local_1c0,false,false,0x7a
              );
    GroupVerifier::GroupVerify
              ((GroupVerifier *)local_118,BECH32,(CoinEligibilityFilter *)local_1c0,true,false,5);
    std::__detail::__variant::
    _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                         *)&local_3f0._M_first);
    std::__detail::__variant::
    _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::~_Variant_storage(&local_380);
    std::__detail::__variant::
    _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                         *)local_310);
    std::__detail::__variant::
    _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::~_Variant_storage(&local_2a0);
    std::__detail::__variant::
    _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                         *)&local_230._M_first);
    std::__detail::__variant::
    _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                         *)&local_168._M_first);
    ChaCha20::~ChaCha20(&local_c0.rng);
    std::
    _Rb_tree<OutputType,_std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<OutputType,_std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
                 *)&local_108);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
    }
    if (local_438._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_438._M_pi);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return;
    }
    __stack_chk_fail();
  }
  __assert_fail("effective_value.has_value()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/coinselection.h"
                ,0x82,"CAmount wallet::COutput::GetEffectiveValue() const");
}

Assistant:

BOOST_AUTO_TEST_CASE(outputs_grouping_tests)
{
    const auto& wallet = NewWallet(m_node);
    GroupVerifier group_verifier;
    group_verifier.wallet = wallet;

    const CoinEligibilityFilter& BASIC_FILTER{1, 6, 0};

    // #################################################################################
    // 10 outputs from different txs going to the same script
    // 1) if partial spends is enabled --> must not be grouped
    // 2) if partial spends is not enabled --> must be grouped into a single OutputGroup
    // #################################################################################

    unsigned long GROUP_SIZE = 10;
    const CTxDestination dest = *Assert(wallet->GetNewDestination(OutputType::BECH32, ""));
    for (unsigned long i = 0; i < GROUP_SIZE; i++) {
        addCoin(group_verifier.coins_pool, *wallet, dest, 10 * COIN, /*is_from_me=*/true);
    }

    group_verifier.GroupAndVerify(OutputType::BECH32,
                                  BASIC_FILTER,
                                  /*expected_with_partial_spends_size=*/ GROUP_SIZE,
                                  /*expected_without_partial_spends_size=*/ 1,
                                  /*positive_only=*/ true);

    // ####################################################################################
    // 3) 10 more UTXO are added with a different script --> must be grouped into a single
    //    group for avoid partial spends and 10 different output groups for partial spends
    // ####################################################################################

    const CTxDestination dest2 = *Assert(wallet->GetNewDestination(OutputType::BECH32, ""));
    for (unsigned long i = 0; i < GROUP_SIZE; i++) {
        addCoin(group_verifier.coins_pool, *wallet, dest2, 5 * COIN, /*is_from_me=*/true);
    }

    group_verifier.GroupAndVerify(OutputType::BECH32,
            BASIC_FILTER,
            /*expected_with_partial_spends_size=*/ GROUP_SIZE * 2,
            /*expected_without_partial_spends_size=*/ 2,
            /*positive_only=*/ true);

    // ################################################################################
    // 4) Now add a negative output --> which will be skipped if "positive_only" is set
    // ################################################################################

    const CTxDestination dest3 = *Assert(wallet->GetNewDestination(OutputType::BECH32, ""));
    addCoin(group_verifier.coins_pool, *wallet, dest3, 1, true, CFeeRate(100));
    BOOST_CHECK(group_verifier.coins_pool.coins[OutputType::BECH32].back().GetEffectiveValue() <= 0);

    // First expect no changes with "positive_only" enabled
    group_verifier.GroupAndVerify(OutputType::BECH32,
            BASIC_FILTER,
            /*expected_with_partial_spends_size=*/ GROUP_SIZE * 2,
            /*expected_without_partial_spends_size=*/ 2,
            /*positive_only=*/ true);

    // Then expect changes with "positive_only" disabled
    group_verifier.GroupAndVerify(OutputType::BECH32,
            BASIC_FILTER,
            /*expected_with_partial_spends_size=*/ GROUP_SIZE * 2 + 1,
            /*expected_without_partial_spends_size=*/ 3,
            /*positive_only=*/ false);


    // ##############################################################################
    // 5) Try to add a non-eligible UTXO (due not fulfilling the min depth target for
    //    "not mine" UTXOs) --> it must not be added to any group
    // ##############################################################################

    const CTxDestination dest4 = *Assert(wallet->GetNewDestination(OutputType::BECH32, ""));
    addCoin(group_verifier.coins_pool, *wallet, dest4, 6 * COIN,
            /*is_from_me=*/false, CFeeRate(0), /*depth=*/5);

    // Expect no changes from this round and the previous one (point 4)
    group_verifier.GroupAndVerify(OutputType::BECH32,
            BASIC_FILTER,
            /*expected_with_partial_spends_size=*/ GROUP_SIZE * 2 + 1,
            /*expected_without_partial_spends_size=*/ 3,
            /*positive_only=*/ false);


    // ##############################################################################
    // 6) Try to add a non-eligible UTXO (due not fulfilling the min depth target for
    //    "mine" UTXOs) --> it must not be added to any group
    // ##############################################################################

    const CTxDestination dest5 = *Assert(wallet->GetNewDestination(OutputType::BECH32, ""));
    addCoin(group_verifier.coins_pool, *wallet, dest5, 6 * COIN,
            /*is_from_me=*/true, CFeeRate(0), /*depth=*/0);

    // Expect no changes from this round and the previous one (point 5)
    group_verifier.GroupAndVerify(OutputType::BECH32,
            BASIC_FILTER,
            /*expected_with_partial_spends_size=*/ GROUP_SIZE * 2 + 1,
            /*expected_without_partial_spends_size=*/ 3,
            /*positive_only=*/ false);

    // ###########################################################################################
    // 7) Surpass the OUTPUT_GROUP_MAX_ENTRIES and verify that a second partial group gets created
    // ###########################################################################################

    const CTxDestination dest7 = *Assert(wallet->GetNewDestination(OutputType::BECH32, ""));
    uint16_t NUM_SINGLE_ENTRIES = 101;
    for (unsigned long i = 0; i < NUM_SINGLE_ENTRIES; i++) { // OUTPUT_GROUP_MAX_ENTRIES{100}
        addCoin(group_verifier.coins_pool, *wallet, dest7, 9 * COIN, /*is_from_me=*/true);
    }

    // Exclude partial groups only adds one more group to the previous test case (point 6)
    int PREVIOUS_ROUND_COUNT = GROUP_SIZE * 2 + 1;
    group_verifier.GroupAndVerify(OutputType::BECH32,
            BASIC_FILTER,
            /*expected_with_partial_spends_size=*/ PREVIOUS_ROUND_COUNT + NUM_SINGLE_ENTRIES,
            /*expected_without_partial_spends_size=*/ 4,
            /*positive_only=*/ false);

    // Include partial groups should add one more group inside the "avoid partial spends" count
    const CoinEligibilityFilter& avoid_partial_groups_filter{1, 6, 0, 0, /*include_partial=*/ true};
    group_verifier.GroupAndVerify(OutputType::BECH32,
            avoid_partial_groups_filter,
            /*expected_with_partial_spends_size=*/ PREVIOUS_ROUND_COUNT + NUM_SINGLE_ENTRIES,
            /*expected_without_partial_spends_size=*/ 5,
            /*positive_only=*/ false);
}